

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O1

void mbedtls_debug_print_buf
               (mbedtls_ssl_context *ssl,int level,char *file,int line,char *text,uchar *buf,
               size_t len)

{
  uchar uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  char txt [17];
  char str [512];
  undefined8 local_258;
  undefined8 uStack_250;
  undefined1 local_248;
  char local_238 [520];
  
  if (((ssl->conf != (mbedtls_ssl_config *)0x0) &&
      (ssl->conf->f_dbg != (_func_void_void_ptr_int_char_ptr_int_char_ptr *)0x0)) &&
     (level <= debug_threshold)) {
    uVar4 = 0;
    snprintf(local_238,0x200,"dumping \'%s\' (%u bytes)\n",text,len & 0xffffffff);
    (*ssl->conf->f_dbg)(ssl->conf->p_dbg,level,file,line,local_238);
    local_258 = 0;
    uStack_250 = 0;
    local_248 = 0;
    if (len == 0) {
      lVar5 = 0;
    }
    else {
      uVar3 = 0xfff;
      if (len - 1 < 0xfff) {
        uVar3 = len - 1;
      }
      lVar5 = 0;
      uVar4 = 0;
      do {
        if ((uVar4 & 0xf) == 0) {
          if (uVar4 != 0) {
            snprintf(local_238 + lVar5,0x200 - lVar5,"  %s\n",&local_258);
            (*ssl->conf->f_dbg)(ssl->conf->p_dbg,level,file,line,local_238);
            local_258 = 0;
            uStack_250 = 0;
            local_248 = 0;
            lVar5 = 0;
          }
          iVar2 = snprintf(local_238 + lVar5,0x200 - lVar5,"%04x: ",uVar4 & 0xffffffff);
          lVar5 = lVar5 + iVar2;
        }
        iVar2 = snprintf(local_238 + lVar5,0x200 - lVar5," %02x",(ulong)buf[uVar4]);
        lVar5 = lVar5 + iVar2;
        uVar1 = buf[uVar4];
        if (0x5e < (byte)(buf[uVar4] - 0x20)) {
          uVar1 = '.';
        }
        *(uchar *)((long)&local_258 + (uVar4 & 0xf)) = uVar1;
        uVar4 = uVar4 + 1;
      } while (uVar3 + 1 != uVar4);
    }
    if (len != 0) {
      for (; (uVar4 & 0xf) != 0; uVar4 = uVar4 + 1) {
        iVar2 = snprintf(local_238 + lVar5,0x200 - lVar5,"   ");
        lVar5 = lVar5 + iVar2;
      }
      snprintf(local_238 + lVar5,0x200 - lVar5,"  %s\n",&local_258);
      (*ssl->conf->f_dbg)(ssl->conf->p_dbg,level,file,line,local_238);
    }
  }
  return;
}

Assistant:

void mbedtls_debug_print_buf( const mbedtls_ssl_context *ssl, int level,
                      const char *file, int line, const char *text,
                      const unsigned char *buf, size_t len )
{
    char str[DEBUG_BUF_SIZE];
    char txt[17];
    size_t i, idx = 0;

    if( ssl->conf == NULL || ssl->conf->f_dbg == NULL || level > debug_threshold )
        return;

    mbedtls_snprintf( str + idx, sizeof( str ) - idx, "dumping '%s' (%u bytes)\n",
              text, (unsigned int) len );

    debug_send_line( ssl, level, file, line, str );

    idx = 0;
    memset( txt, 0, sizeof( txt ) );
    for( i = 0; i < len; i++ )
    {
        if( i >= 4096 )
            break;

        if( i % 16 == 0 )
        {
            if( i > 0 )
            {
                mbedtls_snprintf( str + idx, sizeof( str ) - idx, "  %s\n", txt );
                debug_send_line( ssl, level, file, line, str );

                idx = 0;
                memset( txt, 0, sizeof( txt ) );
            }

            idx += mbedtls_snprintf( str + idx, sizeof( str ) - idx, "%04x: ",
                             (unsigned int) i );

        }

        idx += mbedtls_snprintf( str + idx, sizeof( str ) - idx, " %02x",
                         (unsigned int) buf[i] );
        txt[i % 16] = ( buf[i] > 31 && buf[i] < 127 ) ? buf[i] : '.' ;
    }

    if( len > 0 )
    {
        for( /* i = i */; i % 16 != 0; i++ )
            idx += mbedtls_snprintf( str + idx, sizeof( str ) - idx, "   " );

        mbedtls_snprintf( str + idx, sizeof( str ) - idx, "  %s\n", txt );
        debug_send_line( ssl, level, file, line, str );
    }
}